

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
* wasm::getIgnorablePublicTypes(void)

{
  bool bVar1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this;
  reference pHVar2;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *in_RDI;
  Entry EVar3;
  value_type local_f0;
  HeapType type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range1;
  undefined1 local_c8 [8];
  BuildResult result;
  Array local_98;
  Entry local_88 [2];
  Array local_68;
  TypeBuilder local_58;
  TypeBuilder builder;
  undefined1 local_40 [8];
  Array array16;
  undefined1 local_20 [8];
  Array array8;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *ret;
  
  Field::Field((Field *)&array16.element.packedType,i8,Mutable);
  Array::Array((Array *)local_20,stack0xffffffffffffffd0);
  Field::Field((Field *)&builder,i16,Mutable);
  Array::Array((Array *)local_40,_builder);
  TypeBuilder::TypeBuilder(&local_58,2);
  Array::Array(&local_68,(Array *)local_20);
  local_88[0] = TypeBuilder::operator[](&local_58,0);
  TypeBuilder::Entry::operator=(local_88,&local_68);
  Array::Array(&local_98,(Array *)local_40);
  EVar3 = TypeBuilder::operator[](&local_58,1);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar3.builder;
  TypeBuilder::Entry::operator=
            ((Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),&local_98);
  TypeBuilder::build((BuildResult *)local_c8,&local_58);
  bVar1 = TypeBuilder::BuildResult::operator_cast_to_bool((BuildResult *)local_c8);
  if (bVar1) {
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::unordered_set(in_RDI);
    this = TypeBuilder::BuildResult::operator*((BuildResult *)local_c8);
    __end1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this);
    type.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                  *)&type);
      if (!bVar1) break;
      pHVar2 = __gnu_cxx::
               __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end1);
      local_f0.id = pHVar2->id;
      std::
      unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
      ::insert(in_RDI,&local_f0);
      __gnu_cxx::
      __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end1);
    }
    TypeBuilder::BuildResult::~BuildResult((BuildResult *)local_c8);
    TypeBuilder::~TypeBuilder(&local_58);
    return in_RDI;
  }
  __assert_fail("result",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0xab2,"std::unordered_set<HeapType> wasm::getIgnorablePublicTypes()");
}

Assistant:

std::unordered_set<HeapType> getIgnorablePublicTypes() {
  auto array8 = Array(Field(Field::i8, Mutable));
  auto array16 = Array(Field(Field::i16, Mutable));
  TypeBuilder builder(2);
  builder[0] = array8;
  builder[1] = array16;
  auto result = builder.build();
  assert(result);
  std::unordered_set<HeapType> ret;
  for (auto type : *result) {
    ret.insert(type);
  }
  return ret;
}